

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::TimeCoordinator::requestTimeCheck(TimeCoordinator *this)

{
  bool bVar1;
  iterator this_00;
  reference this_01;
  long in_RDI;
  DependencyInfo *dep;
  iterator __end2;
  iterator __begin2;
  TimeDependencies *__range2;
  ActionMessage timeUpdateRequest;
  ActionMessage *in_stack_fffffffffffffee8;
  action_t in_stack_ffffffffffffff0c;
  ActionMessage *in_stack_ffffffffffffff10;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_d0;
  long local_c8;
  undefined4 local_b8;
  BaseType local_b0;
  
  if ((*(byte *)(in_RDI + 0x25f) & 1) != 0) {
    ActionMessage::ActionMessage(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    local_b8 = *(undefined4 *)(in_RDI + 0x48);
    local_c8 = in_RDI + 8;
    local_d0._M_current =
         (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_stack_fffffffffffffee8);
    this_00 = TimeDependencies::end((TimeDependencies *)in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)this_00._M_current,
                              (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_fffffffffffffee8), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_01 = __gnu_cxx::
                __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                ::operator*(&local_d0);
      if ((((this_01->dependency & 1U) != 0) &&
          (bVar1 = GlobalFederateId::operator==
                             (&this_01->fedID,(GlobalFederateId)*(BaseType *)(in_RDI + 0x48)),
          !bVar1)) &&
         (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                            ((TimeRepresentation<count_time<9,_long>_> *)this_01,
                             (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160)), bVar1))
      {
        local_b0 = (this_01->fedID).gid;
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)this_00._M_current,
                   in_stack_fffffffffffffee8);
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
      ::operator++(&local_d0);
    }
    ActionMessage::~ActionMessage((ActionMessage *)this_00._M_current);
  }
  return;
}

Assistant:

void TimeCoordinator::requestTimeCheck()
{
    if (dynamicJoining) {
        ActionMessage timeUpdateRequest(CMD_REQUEST_CURRENT_TIME);
        timeUpdateRequest.source_id = mSourceId;
        for (const auto& dep : dependencies) {
            // send to all dependencies
            if (dep.dependency) {
                if (dep.fedID == mSourceId) {
                    continue;
                }
                // only send the request if it is blocking the current grant
                if (dep.next < time_exec) {
                    timeUpdateRequest.dest_id = dep.fedID;
                    sendMessageFunction(timeUpdateRequest);
                }
            }
        }
    }
}